

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt-base.h
# Opt level: O1

ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&> * __thiscall
mp::pre::ValueMap<mp::pre::ValueNode,mp::pre::BasicValuePresolver&>::operator=
          (ValueMap<mp::pre::ValueNode,mp::pre::BasicValuePresolver&> *this,
          ValueMap<std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>,_int> *m)

{
  _Rb_tree_iterator<std::pair<const_int,_mp::pre::ValueNode>_> _Var1;
  _Base_ptr p_Var2;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_mp::pre::ValueNode>_>,_bool> pVar3;
  string local_188;
  ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&> *local_160;
  vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_> local_158;
  ValueMap<mp::pre::ValueNode,mp::pre::BasicValuePresolver&> *local_138;
  _Rb_tree_node_base *local_130;
  pair<const_int,_mp::pre::ValueNode> local_128;
  ValueNode local_a8;
  
  p_Var2 = (m->map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_130 = &(m->map_)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_160 = (ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&> *)this;
  if (p_Var2 != local_130) {
    local_138 = this + 0x28;
    do {
      std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>::vector
                (&local_158,
                 (vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_> *)
                 &p_Var2[1]._M_parent);
      local_188._M_string_length = 0;
      local_188.field_2._M_allocated_capacity =
           local_188.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      ValueNode::ValueNode(&local_a8,local_160->prm_,&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      local_128.first = p_Var2[1]._M_color;
      ValueNode::ValueNode(&local_128.second,&local_a8);
      pVar3 = std::
              _Rb_tree<int,std::pair<int_const,mp::pre::ValueNode>,std::_Select1st<std::pair<int_const,mp::pre::ValueNode>>,std::less<int>,std::allocator<std::pair<int_const,mp::pre::ValueNode>>>
              ::_M_insert_unique<std::pair<int_const,mp::pre::ValueNode>>
                        ((_Rb_tree<int,std::pair<int_const,mp::pre::ValueNode>,std::_Select1st<std::pair<int_const,mp::pre::ValueNode>>,std::less<int>,std::allocator<std::pair<int_const,mp::pre::ValueNode>>>
                          *)local_138,&local_128);
      _Var1 = pVar3.first._M_node;
      local_188._M_dataplus._M_p = *(pointer *)(_Var1._M_node + 3);
      local_188._M_string_length = (size_type)_Var1._M_node[3]._M_parent;
      local_188.field_2._M_allocated_capacity = (size_type)_Var1._M_node[3]._M_left;
      *(pointer *)(_Var1._M_node + 3) =
           local_158.super__Vector_base<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>.
           _M_impl.super__Vector_impl_data._M_start;
      _Var1._M_node[3]._M_parent =
           (_Base_ptr)
           local_158.super__Vector_base<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      _Var1._M_node[3]._M_left =
           (_Base_ptr)
           local_158.super__Vector_base<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_158.super__Vector_base<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.super__Vector_base<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158.super__Vector_base<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>::~vector
                ((vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_> *)&local_188);
      std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>::resize
                ((vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_> *)
                 (_Var1._M_node + 3),(size_type)_Var1._M_node[3]._M_right);
      ValueNode::~ValueNode(&local_128.second);
      ValueNode::~ValueNode(&local_a8);
      std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>::~vector(&local_158);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while (p_Var2 != local_130);
  }
  return local_160;
}

Assistant:

ValueMap& operator=(const ValueMap<Array2>& m) {
    for (const auto& a2: m.GetMap())
      map_.insert({
                    a2.first, CreateArray<Array, Param>(prm_)
                  }).first->second =
          a2.second;
    return *this;
  }